

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::anon_unknown_1::BBoxRenderCase::init
          (BBoxRenderCase *this,EVP_PKEY_CTX *ctx)

{
  MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> *this_00;
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  *this_01;
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
  *this_02;
  pointer *ppIVar1;
  Context *pCVar2;
  Context *pCVar3;
  TestLog *log;
  pointer __a;
  pointer pIVar4;
  pointer pIVar5;
  bool bVar6;
  int iVar7;
  ContextType ctxType;
  deUint32 dVar8;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  undefined4 extraout_var;
  RenderTarget *pRVar9;
  size_t sVar10;
  ShaderProgram *this_03;
  undefined4 extraout_var_00;
  ObjectTraits *pOVar11;
  ObjectWrapper *pOVar12;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ulong uVar13;
  pointer pIVar14;
  pointer extraout_RAX;
  pointer pIVar15;
  TestError *this_04;
  NotSupportedError *pNVar16;
  long *plVar17;
  int (*paiVar18) [2];
  long lVar19;
  size_type *psVar20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  int aiVar22 [2];
  IterationConfig *__args;
  IterationConfig *extraout_RDX;
  IterationConfig *__args_00;
  long lVar23;
  ulong uVar24;
  int iVar25;
  ulong uVar26;
  pointer pIVar27;
  char *pcVar28;
  char *pcVar29;
  bool *pbVar30;
  uint uVar31;
  ulong uVar32;
  ScopedLogSection section;
  ProgramSources sources;
  undefined1 local_2b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a8;
  undefined1 local_290 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_280;
  undefined1 local_268 [32];
  int local_248;
  int local_244;
  undefined1 local_240 [32];
  string local_220;
  undefined1 local_200 [32];
  int local_1e0 [2];
  undefined1 local_1d8 [8];
  IVec2 IStack_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8 [6];
  ios_base local_160 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_148;
  undefined1 local_128 [216];
  string local_50;
  
  iVar7 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar19 = CONCAT44(extraout_var,iVar7);
  iVar7 = 0x200;
  iVar25 = 0x200;
  if (this->m_renderTarget == RENDERTARGET_DEFAULT) {
    pRVar9 = Context::getRenderTarget((this->super_TestCase).m_context);
    iVar7 = pRVar9->m_width;
    pRVar9 = Context::getRenderTarget((this->super_TestCase).m_context);
    iVar25 = pRVar9->m_height;
  }
  local_248 = iVar7;
  local_244 = iVar25;
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar6 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (!bVar6) {
    bVar6 = glu::ContextInfo::isExtensionSupported
                      (((this->super_TestCase).m_context)->m_contextInfo,
                       "GL_EXT_primitive_bounding_box");
    if (!bVar6) {
      pNVar16 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      local_1d8 = (undefined1  [8])local_1c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1d8,"Test requires GL_EXT_primitive_bounding_box extension","");
      tcu::NotSupportedError::NotSupportedError(pNVar16,(string *)local_1d8);
      __cxa_throw(pNVar16,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    if ((this->m_hasTessellationStage == true) &&
       (bVar6 = glu::ContextInfo::isExtensionSupported
                          (((this->super_TestCase).m_context)->m_contextInfo,
                           "GL_EXT_tessellation_shader"), !bVar6)) {
      pNVar16 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      local_1d8 = (undefined1  [8])local_1c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1d8,"Test requires GL_EXT_tessellation_shader extension","");
      tcu::NotSupportedError::NotSupportedError(pNVar16,(string *)local_1d8);
      __cxa_throw(pNVar16,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    if ((this->m_hasGeometryStage == true) &&
       (bVar6 = glu::ContextInfo::isExtensionSupported
                          (((this->super_TestCase).m_context)->m_contextInfo,
                           "GL_EXT_geometry_shader"), !bVar6)) {
      pNVar16 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      local_1d8 = (undefined1  [8])local_1c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1d8,"Test requires GL_EXT_geometry_shader extension","");
      tcu::NotSupportedError::NotSupportedError(pNVar16,(string *)local_1d8);
      __cxa_throw(pNVar16,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  if ((this->m_renderTarget == RENDERTARGET_DEFAULT) && ((iVar7 < 0x100 || (iVar25 < 0x100)))) {
    pNVar16 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
    local_220._M_string_length = 0;
    local_220.field_2._M_local_buf[0] = '\0';
    plVar17 = (long *)std::__cxx11::string::append((char *)&local_220);
    local_240._0_8_ = *plVar17;
    psVar20 = (size_type *)(plVar17 + 2);
    if ((size_type *)local_240._0_8_ == psVar20) {
      local_240._16_8_ = *psVar20;
      local_240._24_8_ = plVar17[3];
      local_240._0_8_ = local_240 + 0x10;
    }
    else {
      local_240._16_8_ = *psVar20;
    }
    local_240._8_8_ = plVar17[1];
    *plVar17 = (long)psVar20;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    local_1e0[1] = 0x100;
    de::toString<int>((string *)local_200,local_1e0 + 1);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_240,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_200);
    plVar17 = (long *)std::__cxx11::string::append(local_268);
    local_290._0_8_ = *plVar17;
    paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar17 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._0_8_ == paVar21) {
      local_280._M_allocated_capacity = paVar21->_M_allocated_capacity;
      local_280._8_8_ = plVar17[3];
      local_290._0_8_ = &local_280;
    }
    else {
      local_280._M_allocated_capacity = paVar21->_M_allocated_capacity;
    }
    local_290._8_8_ = plVar17[1];
    *plVar17 = (long)paVar21;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    local_1e0[0] = 0x100;
    de::toString<int>(&local_50,local_1e0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_290,
                   &local_50);
    paiVar18 = (int (*) [2])std::__cxx11::string::append(local_2b8);
    local_1d8 = *(undefined1 (*) [8])paiVar18;
    aiVar22 = (int  [2])(paiVar18 + 2);
    if ((int  [2])local_1d8 == aiVar22) {
      local_1c8[0]._0_8_ = *(undefined8 *)aiVar22;
      local_1c8[0]._8_8_ = *(float (*) [2])(paiVar18 + 3);
      local_1d8 = (undefined1  [8])local_1c8;
    }
    else {
      local_1c8[0]._0_8_ = *(undefined8 *)aiVar22;
    }
    IStack_1d0.m_data = paiVar18[1];
    *paiVar18 = aiVar22;
    paiVar18[1] = (int  [2])0x0;
    *(undefined1 *)paiVar18[2] = 0;
    tcu::NotSupportedError::NotSupportedError(pNVar16,(string *)local_1d8);
    __cxa_throw(pNVar16,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  local_1d8 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&IStack_1d0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&IStack_1d0,"Setting primitive bounding box ",0x1f);
  if (this->m_calcPerPrimitiveBBox == false) {
    if (2 < (ulong)this->m_bboxSize) {
      std::ios::clear((int)(ostringstream *)&IStack_1d0 +
                      (int)*(_func_int **)((long)IStack_1d0.m_data + -0x18));
      goto LAB_0163dfe0;
    }
    pcVar29 = &DAT_01c81848 + *(int *)(&DAT_01c81848 + (ulong)this->m_bboxSize * 4);
  }
  else {
    pcVar29 = "to exactly cover each generated primitive";
  }
  sVar10 = strlen(pcVar29);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&IStack_1d0,pcVar29,sVar10);
LAB_0163dfe0:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&IStack_1d0,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&IStack_1d0,"Rendering with vertex",0x15);
  pcVar29 = "-tessellation{ctrl,eval}";
  pbVar30 = glcts::fixed_sample_locations_values + 1;
  bVar6 = this->m_hasTessellationStage == false;
  if (bVar6) {
    pcVar29 = glcts::fixed_sample_locations_values + 1;
  }
  lVar23 = 0x18;
  if (bVar6) {
    lVar23 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&IStack_1d0,pcVar29,lVar23);
  if ((ulong)this->m_hasGeometryStage != 0) {
    pbVar30 = (bool *)0x1a47f2e;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&IStack_1d0,pbVar30,(ulong)this->m_hasGeometryStage * 9);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&IStack_1d0,"-fragment program.\n",0x13);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&IStack_1d0,"Set bounding box using ",0x17);
  pcVar29 = "PRIMITIVE_BOUNDING_BOX_EXT state";
  pcVar28 = "gl_BoundingBoxEXT output";
  if (this->m_useGlobalState != false) {
    pcVar28 = "PRIMITIVE_BOUNDING_BOX_EXT state";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&IStack_1d0,pcVar28,(ulong)this->m_useGlobalState * 8 + 0x18);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&IStack_1d0,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&IStack_1d0,"Verifying rendering results are valid within the bounding box."
             ,0x3e);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&IStack_1d0);
  std::ios_base::~ios_base(local_160);
  memset(local_1d8,0,0xac);
  local_128._0_8_ = (pointer)0x0;
  local_128[8] = 0;
  local_128._9_7_ = 0;
  local_128[0x10] = 0;
  local_128._17_8_ = 0;
  pCVar2 = (this->super_TestCase).m_context;
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(local_268,this);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            ((string *)local_290,(_anonymous_namespace_ *)pCVar2,(Context *)local_268._0_8_,pcVar29)
  ;
  local_2b8._0_8_ = (ulong)(uint)local_2b8._4_4_ << 0x20;
  pcVar28 = local_2a8._M_local_buf + 8;
  local_2b8._8_8_ = pcVar28;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_2b8 + 8),local_290._0_8_,(char *)(local_290._8_8_ + local_290._0_8_));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1d8 + (local_2b8._0_8_ & 0xffffffff) * 0x18),(value_type *)(local_2b8 + 8));
  if ((char *)local_2b8._8_8_ != pcVar28) {
    operator_delete((void *)local_2b8._8_8_,local_2a8._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._0_8_ != &local_280) {
    operator_delete((void *)local_290._0_8_,local_280._M_allocated_capacity + 1);
  }
  pCVar2 = (Context *)(local_268 + 0x10);
  if ((Context *)local_268._0_8_ != pCVar2) {
    operator_delete((void *)local_268._0_8_,local_268._16_8_ + 1);
  }
  pCVar3 = (this->super_TestCase).m_context;
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])(local_268);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            ((string *)local_290,(_anonymous_namespace_ *)pCVar3,(Context *)local_268._0_8_,pcVar29)
  ;
  local_2b8._0_4_ = 1;
  local_2b8._8_8_ = pcVar28;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_2b8 + 8),local_290._0_8_,(char *)(local_290._8_8_ + local_290._0_8_));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1d8 + (local_2b8._0_8_ & 0xffffffff) * 0x18),(value_type *)(local_2b8 + 8));
  if ((char *)local_2b8._8_8_ != pcVar28) {
    operator_delete((void *)local_2b8._8_8_,local_2a8._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._0_8_ != &local_280) {
    operator_delete((void *)local_290._0_8_,local_280._M_allocated_capacity + 1);
  }
  if ((Context *)local_268._0_8_ != pCVar2) {
    operator_delete((void *)local_268._0_8_,local_268._16_8_ + 1);
  }
  if (this->m_hasTessellationStage == true) {
    pCVar3 = (this->super_TestCase).m_context;
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[7])(local_240);
    Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
              ((string *)local_268,(_anonymous_namespace_ *)pCVar3,(Context *)local_240._0_8_,
               pcVar29);
    local_2b8._0_4_ = 3;
    local_2b8._8_8_ = pcVar28;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_2b8 + 8),local_268._0_8_,
               (pointer)(local_268._0_8_ + local_268._8_8_));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_1d8 + (local_2b8._0_8_ & 0xffffffff) * 0x18),(value_type *)(local_2b8 + 8)
               );
    pCVar3 = (this->super_TestCase).m_context;
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[8])(local_200);
    Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
              (&local_220,(_anonymous_namespace_ *)pCVar3,(Context *)local_200._0_8_,pcVar29);
    local_290._0_4_ = 4;
    local_290._8_8_ = local_280._M_local_buf + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_290 + 8),local_220._M_dataplus._M_p,
               local_220._M_dataplus._M_p + local_220._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_1d8 + (local_290._0_8_ & 0xffffffff) * 0x18),(value_type *)(local_290 + 8)
               );
    if ((char *)local_290._8_8_ != local_280._M_local_buf + 8) {
      operator_delete((void *)local_290._8_8_,local_280._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,
                      CONCAT71(local_220.field_2._M_allocated_capacity._1_7_,
                               local_220.field_2._M_local_buf[0]) + 1);
    }
    if ((Context *)local_200._0_8_ != (Context *)(local_200 + 0x10)) {
      operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
    }
    if ((char *)local_2b8._8_8_ != pcVar28) {
      operator_delete((void *)local_2b8._8_8_,local_2a8._8_8_ + 1);
    }
    if ((Context *)local_268._0_8_ != pCVar2) {
      operator_delete((void *)local_268._0_8_,local_268._16_8_ + 1);
    }
    if ((Context *)local_240._0_8_ != (Context *)(local_240 + 0x10)) {
      operator_delete((void *)local_240._0_8_,local_240._16_8_ + 1);
    }
  }
  if (this->m_hasGeometryStage == true) {
    pCVar3 = (this->super_TestCase).m_context;
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[9])(local_268);
    Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
              ((string *)local_290,(_anonymous_namespace_ *)pCVar3,(Context *)local_268._0_8_,
               pcVar29);
    local_2b8._0_4_ = 2;
    local_2b8._8_8_ = pcVar28;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_2b8 + 8),local_290._0_8_,(char *)(local_290._8_8_ + local_290._0_8_)
              );
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_1d8 + (local_2b8._0_8_ & 0xffffffff) * 0x18),(value_type *)(local_2b8 + 8)
               );
    if ((char *)local_2b8._8_8_ != pcVar28) {
      operator_delete((void *)local_2b8._8_8_,local_2a8._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._0_8_ != &local_280) {
      operator_delete((void *)local_290._0_8_,local_280._M_allocated_capacity + 1);
    }
    if ((Context *)local_268._0_8_ != pCVar2) {
      operator_delete((void *)local_268._0_8_,local_268._16_8_ + 1);
    }
  }
  this_03 = (ShaderProgram *)operator_new(0xd0);
  glu::ShaderProgram::ShaderProgram
            (this_03,((this->super_TestCase).m_context)->m_renderCtx,(ProgramSources *)local_1d8);
  local_2b8._0_8_ = (ShaderProgram *)0x0;
  this_00 = &this->m_program;
  if ((this->m_program).
      super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>.m_data.ptr !=
      this_03) {
    de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::reset
              (&this_00->
                super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>);
    (this_00->super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>).m_data.
    ptr = this_03;
  }
  de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::reset
            ((UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> *)local_2b8);
  dVar8 = (**(code **)(lVar19 + 0x800))();
  glu::checkError(dVar8,"build program",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                  ,0x2b4);
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_2b8._0_8_ = &local_2a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"ShaderProgram","");
  local_290._0_8_ = &local_280;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"Shader program","");
  tcu::ScopedLogSection::ScopedLogSection
            ((ScopedLogSection *)local_268,log,(string *)local_2b8,(string *)local_290);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._0_8_ != &local_280) {
    operator_delete((void *)local_290._0_8_,local_280._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._0_8_ != &local_2a8) {
    operator_delete((void *)local_2b8._0_8_,local_2a8._M_allocated_capacity + 1);
  }
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  (this->m_program).
                  super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>.
                  m_data.ptr);
  tcu::TestLog::endSection((TestLog *)local_268._0_8_);
  if ((((this_00->super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>).
        m_data.ptr)->m_program).m_info.linkOk != false) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_128);
    std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
              (&local_148);
    lVar23 = 0x78;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_1d8 + lVar23));
      lVar23 = lVar23 + -0x18;
    } while (lVar23 != -0x18);
    if (this->m_renderTarget == RENDERTARGET_FBO) {
      iVar7 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
      pOVar11 = glu::objectTraits(OBJECTTYPE_TEXTURE);
      glu::ObjectWrapper::ObjectWrapper
                ((ObjectWrapper *)local_1d8,(Functions *)CONCAT44(extraout_var_00,iVar7),pOVar11);
      (**(code **)(lVar19 + 0xb8))(0xde1,local_1c8[0]._M_allocated_capacity & 0xffffffff);
      (**(code **)(lVar19 + 0x1380))(0xde1,1,0x8058,0x200,0x200);
      dVar8 = (**(code **)(lVar19 + 0x800))();
      glu::checkError(dVar8,"gen tex",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                      ,0x2c5);
      pOVar12 = (ObjectWrapper *)operator_new(0x18);
      iVar7 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
      pOVar11 = glu::objectTraits(OBJECTTYPE_FRAMEBUFFER);
      glu::ObjectWrapper::ObjectWrapper
                (pOVar12,(Functions *)CONCAT44(extraout_var_01,iVar7),pOVar11);
      local_2b8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      this_01 = &this->m_fbo;
      if (&((this->m_fbo).
            super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
            .m_data.ptr)->super_ObjectWrapper != pOVar12) {
        de::details::
        UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
        ::reset(&this_01->
                 super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
               );
        (this_01->
        super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
        ).m_data.ptr = (TypedObjectWrapper<(glu::ObjectType)3> *)pOVar12;
      }
      de::details::
      UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
      ::reset((UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
               *)local_2b8);
      (**(code **)(lVar19 + 0x78))
                (0x8ca9,(((this_01->
                          super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
                          ).m_data.ptr)->super_ObjectWrapper).m_object);
      (**(code **)(lVar19 + 0x6a0))
                (0x8ca9,0x8ce0,0xde1,local_1c8[0]._M_allocated_capacity & 0xffffffff,0);
      dVar8 = (**(code **)(lVar19 + 0x800))();
      glu::checkError(dVar8,"attach",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                      ,0x2ca);
      (**(code **)(lVar19 + 0x78))(0x8ca9,0);
      glu::ObjectWrapper::~ObjectWrapper((ObjectWrapper *)local_1d8);
    }
    local_1d8._0_4_ = 0;
    local_1d8._4_4_ = 0;
    IStack_1d0.m_data[0] = 0;
    IStack_1d0.m_data[1] = 0;
    local_1c8[0]._0_4_ = 0.0;
    local_1c8[0]._4_4_ = 0.0;
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0xb])(this);
    pOVar12 = (ObjectWrapper *)operator_new(0x18);
    iVar7 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    pOVar11 = glu::objectTraits(OBJECTTYPE_BUFFER);
    glu::ObjectWrapper::ObjectWrapper(pOVar12,(Functions *)CONCAT44(extraout_var_02,iVar7),pOVar11);
    local_2b8._0_8_ = (ShaderProgram *)0x0;
    this_02 = &this->m_vbo;
    if (&((this->m_vbo).
          super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
          .m_data.ptr)->super_ObjectWrapper != pOVar12) {
      de::details::
      UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
      ::reset(&this_02->
               super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
             );
      (this_02->
      super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
      ).m_data.ptr = (TypedObjectWrapper<(glu::ObjectType)1> *)pOVar12;
    }
    de::details::
    UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
    ::reset((UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
             *)local_2b8);
    (**(code **)(lVar19 + 0x40))
              (0x8892,(((this_02->
                        super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
                        ).m_data.ptr)->super_ObjectWrapper).m_object);
    (**(code **)(lVar19 + 0x150))
              (0x8892,(long)(IStack_1d0.m_data[0] - local_1d8._0_4_) & 0xfffffffffffffff0,local_1d8,
               0x88e4);
    dVar8 = (**(code **)(lVar19 + 0x800))();
    glu::checkError(dVar8,"create vbo",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                    ,0x2d8);
    iVar7 = extraout_EAX;
    if ((int  [2])local_1d8 != (int  [2])0x0) {
      operator_delete((void *)local_1d8,local_1c8[0]._M_allocated_capacity - (long)local_1d8);
      iVar7 = extraout_EAX_00;
    }
    if (0 < this->m_numIterations) {
      uVar32 = 0;
      do {
        (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[10])
                  ((IterationConfig *)local_1d8,this,uVar32,&local_248);
        __a = (this->m_iterationConfigs).
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig>_>
              ._M_impl.super__Vector_impl_data._M_finish;
        if (__a == (this->m_iterationConfigs).
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          pIVar4 = (this->m_iterationConfigs).
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((long)__a - (long)pIVar4 == 0x7fffffffffffffc0) {
            std::__throw_length_error("vector::_M_realloc_insert");
          }
          uVar26 = (long)__a - (long)pIVar4 >> 6;
          uVar13 = uVar26;
          if (__a == pIVar4) {
            uVar13 = 1;
          }
          uVar24 = uVar13 + uVar26;
          if (0x1fffffffffffffe < uVar24) {
            uVar24 = 0x1ffffffffffffff;
          }
          if (CARRY8(uVar13,uVar26)) {
            uVar24 = 0x1ffffffffffffff;
          }
          if (uVar24 == 0) {
            pIVar14 = (pointer)0x0;
            __args_00 = __args;
          }
          else {
            pIVar14 = (pointer)operator_new(uVar24 << 6);
            __args_00 = extraout_RDX;
          }
          std::
          allocator_traits<std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig>>
          ::
          construct<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig,deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig>
                    ((allocator_type *)(pIVar14 + uVar26),(IterationConfig *)local_1d8,__args_00);
          pIVar15 = pIVar4;
          pIVar5 = extraout_RAX;
          pIVar27 = pIVar14;
          while (__a != pIVar15) {
            (pIVar27->viewportPos).m_data[0] = (pIVar15->viewportPos).m_data[0];
            (pIVar27->viewportPos).m_data[1] = (pIVar15->viewportPos).m_data[1];
            (pIVar27->viewportSize).m_data[0] = (pIVar15->viewportSize).m_data[0];
            (pIVar27->viewportSize).m_data[1] = (pIVar15->viewportSize).m_data[1];
            (pIVar27->patternPos).m_data[0] = (pIVar15->patternPos).m_data[0];
            (pIVar27->patternPos).m_data[1] = (pIVar15->patternPos).m_data[1];
            (pIVar27->patternSize).m_data[0] = (pIVar15->patternSize).m_data[0];
            (pIVar27->patternSize).m_data[1] = (pIVar15->patternSize).m_data[1];
            lVar19 = 8;
            do {
              (pIVar27->viewportPos).m_data[lVar19] = (pIVar15->viewportPos).m_data[lVar19];
              lVar19 = lVar19 + 1;
            } while (lVar19 != 0xc);
            lVar19 = 0xc;
            do {
              (pIVar27->viewportPos).m_data[lVar19] = (pIVar15->viewportPos).m_data[lVar19];
              lVar19 = lVar19 + 1;
            } while (lVar19 != 0x10);
            pIVar27 = pIVar27 + 1;
            pIVar15 = pIVar15 + 1;
            pIVar5 = pIVar15;
          }
          iVar7 = (int)pIVar5;
          if (pIVar4 != (pointer)0x0) {
            operator_delete(pIVar4,(long)(this->m_iterationConfigs).
                                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                   (long)pIVar4);
            iVar7 = extraout_EAX_02;
          }
          (this->m_iterationConfigs).
          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig>_>
          ._M_impl.super__Vector_impl_data._M_start = pIVar14;
          (this->m_iterationConfigs).
          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig>_>
          ._M_impl.super__Vector_impl_data._M_finish = pIVar27 + 1;
          (this->m_iterationConfigs).
          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = pIVar14 + uVar24;
        }
        else {
          std::
          allocator_traits<std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig>>
          ::
          construct<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig,deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig>
                    ((allocator_type *)__a,(IterationConfig *)local_1d8,__args);
          ppIVar1 = &(this->m_iterationConfigs).
                     super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppIVar1 = *ppIVar1 + 1;
          iVar7 = extraout_EAX_01;
        }
        uVar31 = (int)uVar32 + 1;
        uVar32 = (ulong)uVar31;
      } while ((int)uVar31 < this->m_numIterations);
    }
    return iVar7;
  }
  this_04 = (TestError *)__cxa_allocate_exception(0x38);
  local_2b8._0_8_ = &local_2a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"failed to build program","");
  tcu::TestError::TestError(this_04,(string *)local_2b8);
  __cxa_throw(this_04,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void BBoxRenderCase::init (void)
{
	const glw::Functions&	gl					= m_context.getRenderContext().getFunctions();
	const tcu::IVec2		renderTargetSize	= (m_renderTarget == RENDERTARGET_DEFAULT) ?
													(tcu::IVec2(m_context.getRenderTarget().getWidth(), m_context.getRenderTarget().getHeight())) :
													(tcu::IVec2(FBO_SIZE, FBO_SIZE));
	const bool				supportsES32		= glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	// requirements
	if (!supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_EXT_primitive_bounding_box"))
		throw tcu::NotSupportedError("Test requires GL_EXT_primitive_bounding_box extension");
	if (!supportsES32 && m_hasTessellationStage && !m_context.getContextInfo().isExtensionSupported("GL_EXT_tessellation_shader"))
		throw tcu::NotSupportedError("Test requires GL_EXT_tessellation_shader extension");
	if (!supportsES32 && m_hasGeometryStage && !m_context.getContextInfo().isExtensionSupported("GL_EXT_geometry_shader"))
		throw tcu::NotSupportedError("Test requires GL_EXT_geometry_shader extension");
	if (m_renderTarget == RENDERTARGET_DEFAULT && (renderTargetSize.x() < RENDER_TARGET_MIN_SIZE || renderTargetSize.y() < RENDER_TARGET_MIN_SIZE))
		throw tcu::NotSupportedError(std::string() + "Test requires " + de::toString<int>(RENDER_TARGET_MIN_SIZE) + "x" + de::toString<int>(RENDER_TARGET_MIN_SIZE) + " default framebuffer");

	// log case specifics
	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Setting primitive bounding box "
			<< ((m_calcPerPrimitiveBBox)         ? ("to exactly cover each generated primitive")
			  : (m_bboxSize == BBOXSIZE_EQUAL)   ? ("to exactly cover rendered grid")
			  : (m_bboxSize == BBOXSIZE_LARGER)  ? ("to cover the grid and include some padding")
			  : (m_bboxSize == BBOXSIZE_SMALLER) ? ("to cover only a subset of the grid")
			  : (DE_NULL))
			<< ".\n"
		<< "Rendering with vertex"
			<< ((m_hasTessellationStage) ? ("-tessellation{ctrl,eval}") : (""))
			<< ((m_hasGeometryStage) ? ("-geometry") : (""))
			<< "-fragment program.\n"
		<< "Set bounding box using "
			<< ((m_useGlobalState) ? ("PRIMITIVE_BOUNDING_BOX_EXT state") : ("gl_BoundingBoxEXT output"))
			<< "\n"
		<< "Verifying rendering results are valid within the bounding box."
		<< tcu::TestLog::EndMessage;

	// resources

	{
		glu::ProgramSources sources;
		sources << glu::VertexSource(specializeShader(m_context, genVertexSource().c_str()));
		sources << glu::FragmentSource(specializeShader(m_context, genFragmentSource().c_str()));

		if (m_hasTessellationStage)
			sources << glu::TessellationControlSource(specializeShader(m_context, genTessellationControlSource().c_str()))
					<< glu::TessellationEvaluationSource(specializeShader(m_context, genTessellationEvaluationSource().c_str()));
		if (m_hasGeometryStage)
			sources << glu::GeometrySource(specializeShader(m_context, genGeometrySource().c_str()));

		m_program = de::MovePtr<glu::ShaderProgram>(new glu::ShaderProgram(m_context.getRenderContext(), sources));
		GLU_EXPECT_NO_ERROR(gl.getError(), "build program");

		{
			const tcu::ScopedLogSection section(m_testCtx.getLog(), "ShaderProgram", "Shader program");
			m_testCtx.getLog() << *m_program;
		}

		if (!m_program->isOk())
			throw tcu::TestError("failed to build program");
	}

	if (m_renderTarget == RENDERTARGET_FBO)
	{
		glu::Texture colorAttachment(m_context.getRenderContext());

		gl.bindTexture(GL_TEXTURE_2D, *colorAttachment);
		gl.texStorage2D(GL_TEXTURE_2D, 1, GL_RGBA8, FBO_SIZE, FBO_SIZE);
		GLU_EXPECT_NO_ERROR(gl.getError(), "gen tex");

		m_fbo = de::MovePtr<glu::Framebuffer>(new glu::Framebuffer(m_context.getRenderContext()));
		gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, **m_fbo);
		gl.framebufferTexture2D(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, *colorAttachment, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "attach");

		// unbind to prevent texture name deletion from removing it from current fbo attachments
		gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, 0);
	}

	{
		std::vector<tcu::Vec4> data;

		getAttributeData(data);

		m_vbo = de::MovePtr<glu::Buffer>(new glu::Buffer(m_context.getRenderContext()));
		gl.bindBuffer(GL_ARRAY_BUFFER, **m_vbo);
		gl.bufferData(GL_ARRAY_BUFFER, (int)(data.size() * sizeof(tcu::Vec4)), &data[0], GL_STATIC_DRAW);
		GLU_EXPECT_NO_ERROR(gl.getError(), "create vbo");
	}

	// Iterations
	for (int iterationNdx = 0; iterationNdx < m_numIterations; ++iterationNdx)
		m_iterationConfigs.push_back(generateConfig(iterationNdx, renderTargetSize));
}